

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xp_getpass.h
# Opt level: O0

char * xp_getpass(char *prompt)

{
  char *pcVar1;
  char *prompt_local;
  
  pcVar1 = getpass(prompt);
  return pcVar1;
}

Assistant:

static inline char* 
xp_getpass(const char* prompt)
{
    #ifdef __APPLE__
        return getpass(prompt);
    #else

        // seems like getpass works with no warnings on Linux too.
        #if 0
            return term_getpass(prompt);
        #else
            return getpass(prompt);
        #endif

    #endif
}